

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

QObject * __thiscall QPointerEvent::exclusiveGrabber(QPointerEvent *this,QEventPoint *point)

{
  QPointingDevicePrivate *this_00;
  EventPointData *pEVar1;
  QDebug *o;
  QDebug *in_RSI;
  QPointerEvent *in_RDI;
  long in_FS_OFFSET;
  EventPointData *persistentPoint;
  char *in_stack_ffffffffffffff88;
  QEventPoint *in_stack_ffffffffffffff90;
  int line;
  QObject *local_48;
  int in_stack_ffffffffffffffcc;
  QEventPoint *in_stack_ffffffffffffffd8;
  QDebug in_stack_ffffffffffffffe0;
  QDebug local_18;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pointingDevice(in_RDI);
  this_00 = QPointingDevicePrivate::get((QPointingDevice *)0x34a562);
  QEventPoint::id(in_stack_ffffffffffffff90);
  line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  pEVar1 = QPointingDevicePrivate::queryPointById(this_00,in_stack_ffffffffffffffcc);
  if (pEVar1 == (EventPointData *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)0x0,(char *)this_00,line,in_stack_ffffffffffffff88);
    QMessageLogger::warning();
    o = QDebug::operator<<(in_RSI,(char *)in_stack_ffffffffffffffd8);
    QDebug::QDebug(&local_18,o);
    ::operator<<((QDebug *)in_stack_ffffffffffffffe0.stream,in_stack_ffffffffffffffd8);
    QDebug::~QDebug(&local_10);
    QDebug::~QDebug(&local_18);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffe0);
    local_48 = (QObject *)0x0;
  }
  else {
    local_48 = ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0x34a622);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

QObject *QPointerEvent::exclusiveGrabber(const QEventPoint &point) const
{
    Q_ASSERT(pointingDevice());
    auto persistentPoint = QPointingDevicePrivate::get(pointingDevice())->queryPointById(point.id());
    if (Q_UNLIKELY(!persistentPoint)) {
        qWarning() << "point is not in activePoints" << point;
        return nullptr;
    }
    return persistentPoint->exclusiveGrabber;
}